

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_0.cpp
# Opt level: O2

void __thiscall
ParserTransform_attemptToParseUnknownXmlModelWith20Parser_Test::
~ParserTransform_attemptToParseUnknownXmlModelWith20Parser_Test
          (ParserTransform_attemptToParseUnknownXmlModelWith20Parser_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTransform, attemptToParseUnknownXmlModelWith20Parser)
{
    const std::string e = "Model element is in an invalid namespace 'http://www.cellml.org/cellml/1.3#'. A valid CellML root node should be in the namespace 'http://www.cellml.org/cellml/2.0#'.";
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/1.3#\" name=\"name\"/>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(in);

    EXPECT_EQ("", model->name());
    EXPECT_EQ(size_t(1), parser->issueCount());
    EXPECT_EQ(libcellml::Issue::Level::ERROR, parser->issue(0)->level());
    EXPECT_EQ(e, parser->issue(0)->description());
}